

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

shared_ptr<Token> __thiscall Tokenizer::nextToken(Tokenizer *this)

{
  unsigned_long *__args_3;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer psVar6;
  undefined1 auVar7 [8];
  _Alloc_hider _Var8;
  element_type *peVar9;
  char cVar10;
  bool bVar11;
  uint uVar12;
  long lVar13;
  undefined8 *puVar14;
  size_type *psVar15;
  long extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  undefined8 *in_RSI;
  pointer psVar17;
  pointer psVar18;
  shared_ptr<Token> sVar19;
  int local_a4;
  undefined8 local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  element_type *local_90;
  undefined1 auStack_88 [8];
  string str;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined1 local_58;
  undefined1 uStack_57;
  undefined6 uStack_56;
  size_type sStack_50;
  int local_3c;
  undefined1 local_35;
  TokenType local_34 [2];
  TokenType matchTokenType;
  
  cVar10 = (**(code **)(*(long *)*in_RSI + 0x10))((long *)*in_RSI,0);
  psVar6 = rules.
           super__Vector_base<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (cVar10 == '\0') {
    str.field_2._8_4_ = 1;
    local_34[0] = Unknown;
    local_3c = 0;
    local_a4 = 0;
    auStack_88 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Token,std::allocator<Token>,char_const(&)[10],TokenType,int,int,int>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&str,(Token **)auStack_88,
               (allocator<Token> *)&local_35,(char (*) [10])"EndOfFile",
               (TokenType *)(str.field_2._M_local_buf + 8),(int *)local_34,&local_3c,&local_a4);
    _Var8 = str._M_dataplus;
    auVar7 = auStack_88;
    auStack_88 = (undefined1  [8])0x0;
    str._M_dataplus._M_p = (pointer)0x0;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[6];
    in_RSI[5] = auVar7;
    in_RSI[6] = _Var8._M_p;
    _Var16._M_pi = extraout_RDX_00;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
       _Var16._M_pi = extraout_RDX_01, str._M_dataplus._M_p != (pointer)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)str._M_dataplus._M_p);
      _Var16._M_pi = extraout_RDX_02;
    }
  }
  else {
    local_34[0] = Unknown;
    psVar18 = rules.
              super__Vector_base<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar9 = (element_type *)this;
    if (rules.
        super__Vector_base<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        rules.
        super__Vector_base<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_90 = peVar9;
        psVar17 = psVar18 + 1;
        peVar1 = (psVar18->super___shared_ptr<TokenizerRule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_a0 = *in_RSI;
        local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
        if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_98->_M_use_count = local_98->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_98->_M_use_count = local_98->_M_use_count + 1;
          }
        }
        uVar12 = (**peVar1->_vptr_TokenizerRule)(peVar1,&local_a0);
        if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
        }
        local_34[0] = (*((psVar18->super___shared_ptr<TokenizerRule,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->_vptr_TokenizerRule[1])();
        this = (Tokenizer *)local_90;
      } while (((uVar12 & 1) == 0) && (psVar18 = psVar17, peVar9 = local_90, psVar17 != psVar6));
      if (((uVar12 & 1) != 0) && ((extraout_RDX != 0 && (local_34[0] != Unknown)))) {
        (**(code **)(*(long *)*in_RSI + 0x28))(auStack_88,(long *)*in_RSI,extraout_RDX);
        __args_3 = in_RSI + 3;
        str.field_2._8_8_ = 0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Token,std::allocator<Token>,std::__cxx11::string&,TokenType&,unsigned_long&,unsigned_long&,unsigned_long&>
                  (&_Stack_60,(Token **)((long)&str.field_2 + 8),(allocator<Token> *)&local_3c,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88,
                   local_34,in_RSI + 2,__args_3,in_RSI + 4);
        _Var16._M_pi = _Stack_60._M_pi;
        uVar3 = str.field_2._8_8_;
        str.field_2._8_8_ = 0;
        _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[6];
        in_RSI[5] = uVar3;
        in_RSI[6] = _Var16._M_pi;
        if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
           _Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
        }
        bVar11 = Token::isNewLine((string *)auStack_88);
        if (bVar11) {
          *__args_3 = *__args_3 + 1;
          lVar13 = 1;
        }
        else {
          lVar13 = in_RSI[4] + extraout_RDX;
        }
        in_RSI[4] = lVar13;
        in_RSI[2] = in_RSI[2] + extraout_RDX;
        (**(code **)(*(long *)*in_RSI + 0x18))((long *)*in_RSI,extraout_RDX);
        _Var16._M_pi = extraout_RDX_04;
        if (auStack_88 != (undefined1  [8])&str._M_string_length) {
          operator_delete((void *)auStack_88,str._M_string_length + 1);
          _Var16._M_pi = extraout_RDX_05;
        }
        goto LAB_00113b16;
      }
    }
    local_58 = (**(code **)(*(long *)*in_RSI + 0x10))((long *)*in_RSI,0);
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
    uStack_57 = 0;
    str.field_2._8_8_ = &local_58;
    puVar14 = (undefined8 *)operator_new(0x50);
    _Var16._M_pi = _Stack_60._M_pi;
    puVar14[1] = 0x100000001;
    *puVar14 = &PTR___Sp_counted_ptr_inplace_0012f848;
    if ((undefined1 *)str.field_2._8_8_ == &local_58) {
      str.field_2._M_allocated_capacity = sStack_50;
      str.field_2._8_8_ = &str._M_string_length;
    }
    str._M_string_length = CONCAT62(uStack_56,CONCAT11(uStack_57,local_58));
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58 = 0;
    uVar3 = in_RSI[2];
    uVar4 = in_RSI[3];
    uVar5 = in_RSI[4];
    psVar15 = puVar14 + 4;
    puVar14[2] = psVar15;
    if ((size_type *)str.field_2._8_8_ == &str._M_string_length) {
      *psVar15 = str._M_string_length;
      puVar14[5] = str.field_2._M_allocated_capacity;
    }
    else {
      puVar14[2] = str.field_2._8_8_;
      *psVar15 = str._M_string_length;
    }
    puVar14[3] = _Var16._M_pi;
    *(undefined4 *)(puVar14 + 6) = 0;
    puVar14[7] = uVar3;
    puVar14[8] = uVar4;
    puVar14[9] = uVar5;
    in_RSI[5] = puVar14 + 2;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[6];
    in_RSI[6] = puVar14;
    str.field_2._8_8_ = &local_58;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
       (undefined1 *)str.field_2._8_8_ != &local_58)) {
      operator_delete((void *)str.field_2._8_8_,CONCAT62(uStack_56,CONCAT11(uStack_57,local_58)) + 1
                     );
    }
    in_RSI[2] = in_RSI[2] + 1;
    in_RSI[4] = in_RSI[4] + 1;
    (**(code **)(*(long *)*in_RSI + 0x18))((long *)*in_RSI,1);
    _Var16._M_pi = extraout_RDX_03;
  }
LAB_00113b16:
  ((__shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2> *)
  &(((element_type *)this)->value)._M_dataplus)->_M_ptr = (element_type *)in_RSI[5];
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[6];
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(((element_type *)this)->value)._M_string_length)
  ->_M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  sVar19.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var16._M_pi;
  sVar19.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Token>)sVar19.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Token> Tokenizer::nextToken() noexcept {

  if (this->reader->charAt(0) == '\0') {
    this->token = std::make_shared<Token>("EndOfFile", TokenType::EndOfFile, 0, 0, 0);
    return this->token;
  }

  bool match = false;
  std::size_t matchSize = 0;
  TokenType matchTokenType = TokenType::Unknown;

  for (auto & rule : rules) {
    auto result = rule->tryMatch(this->reader);

    match = result.first;
    matchSize = result.second;
    matchTokenType = rule->getType();

    if (match) { break; }
  }

  if (match && matchSize > 0 && matchTokenType != TokenType::Unknown) {

    std::string str = this->reader->subString(matchSize);

    this->token = std::make_shared<Token>(
      str, matchTokenType, this->sourceIndex, this->sourceLine, this->sourceColumn);

    if (Token::isNewLine(str)) {
      this->sourceColumn = 1;
      this->sourceLine += 1;
    } else {
      this->sourceColumn += matchSize;
    }

    this->sourceIndex += matchSize;

    this->reader->advance(matchSize);

  } else {

    this->token = std::make_shared<Token>(
      std::string{this->reader->charAt(0)}, TokenType::Unknown,
      this->sourceIndex, this->sourceLine, this->sourceColumn);

    this->sourceIndex++;
    this->sourceColumn++;

    this->reader->advance(1);
  }

  return this->token;
}